

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnDataDrop(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  char *pcVar4;
  int __c;
  Var *__s;
  Var VStack_68;
  
  __s = &VStack_68;
  RVar1 = CheckInstr(this,(Opcode)0xd0,loc);
  Var::Var(&VStack_68,segment_var);
  RVar2 = CheckDataSegmentIndex(this,&VStack_68);
  Var::~Var(&VStack_68);
  pcVar4 = Var::index(segment_var,(char *)__s,__c);
  RVar3 = TypeChecker::OnDataDrop(&this->typechecker_,(uint32_t)pcVar4);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnDataDrop(const Location& loc, Var segment_var) {
  Result result = CheckInstr(Opcode::DataDrop, loc);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnDataDrop(segment_var.index());
  return result;
}